

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alListeneriv(ALenum param,ALint *values)

{
  long lVar1;
  long lStack_30;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alListeneriv);
  writele32(param);
  IO_UINT64((uint64)values);
  if (param == 0x100f) {
    lStack_30 = 6;
  }
  else if ((param == 0x1006) || (param == 0x1004)) {
    lStack_30 = 3;
  }
  else {
    lStack_30 = 1;
  }
  lVar1 = 0;
  if (values == (ALint *)0x0) {
    lStack_30 = lVar1;
  }
  writele32((uint32)lStack_30);
  for (; lStack_30 != lVar1; lVar1 = lVar1 + 1) {
    writele32(values[lVar1]);
  }
  (*REAL_alListeneriv)(param,values);
  check_listener_state();
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alListeneriv(ALenum param, const ALint *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alListeneriv);
    IO_ENUM(param);
    IO_PTR(values);
    switch (param) {
        case AL_POSITION: numvals = 3; break;
        case AL_VELOCITY: numvals = 3; break;
        case AL_ORIENTATION: numvals = 6; break;
        default: break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }
    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }

    REAL_alListeneriv(param, values);

    check_listener_state();

    IO_END();
}